

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void decompressBlockTHUMB58HAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alpha,int width,int height,
               int startx,int starty,int channelsRGB)

{
  byte bVar1;
  long lVar2;
  uint8 (*in_RCX) [3];
  long in_RDX;
  uint in_ESI;
  uint in_EDI;
  int in_R8D;
  undefined4 in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  uint8 y;
  int in_stack_00000018;
  uint8 x;
  int channelsA;
  uint8 block_mask [4] [4];
  uint8 distance;
  uint8 paint_colors [4] [3];
  uint8 colorsRGB444 [2] [3];
  uint8 colors [2] [3];
  uint col1;
  uint col0;
  byte local_5e;
  byte local_5d;
  int local_5c;
  byte local_58 [23];
  byte local_41;
  byte local_40 [12];
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  byte local_30;
  byte local_2f;
  uint8 local_2e [6];
  uint local_28;
  uint local_24;
  
  if (in_stack_00000018 == 3) {
    local_5c = 1;
  }
  else {
    local_5c = 4;
    in_RCX = (uint8 (*) [3])(in_RDX + 3);
  }
  local_34 = (byte)(in_EDI >> 0x16) & 0xf;
  local_33 = (byte)(in_EDI >> 0x12) & 0xf;
  local_32 = (byte)(in_EDI >> 0xe) & 0xf;
  local_31 = (byte)(in_EDI >> 10) & 0xf;
  local_30 = (byte)(in_EDI >> 6) & 0xf;
  local_2f = (byte)(in_EDI >> 2) & 0xf;
  local_41 = (byte)((in_EDI & 3) << 1);
  local_24 = in_EDI >> 0xe & 0xfff;
  local_28 = in_EDI >> 2 & 0xfff;
  if (local_28 <= local_24) {
    local_41 = local_41 | 1;
  }
  decompressColor(4,4,4,(uint8 (*) [3])&local_34,(uint8 (*) [3])local_2e);
  calculatePaintColors58H
            ((uint8)((ulong)in_RDX >> 0x38),(uint8)((ulong)in_RDX >> 0x30),in_RCX,
             (uint8 (*) [3])CONCAT44(in_R8D,in_R9D));
  for (local_5d = 0; local_5d < 4; local_5d = local_5d + 1) {
    for (local_5e = 0; local_5e < 4; local_5e = local_5e + 1) {
      local_58[(ulong)local_5e + (ulong)local_5d * 4] =
           (byte)((in_ESI >> (local_5e + local_5d * '\x04' + 0x10 & 0x1f) & 1) << 1);
      lVar2 = (ulong)local_5d * 4 + -0x58;
      local_58[(ulong)local_5e + lVar2 + 0x58] =
           local_58[(ulong)local_5e + lVar2 + 0x58] |
           (byte)(in_ESI >> (local_5e + local_5d * '\x04' & 0x1f)) & 1;
      if ((int)(uint)local_40[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3] < 0) {
        bVar1 = 0;
      }
      else if (local_40[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3] < 0x100) {
        bVar1 = local_40[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3];
      }
      else {
        bVar1 = 0xff;
      }
      *(byte *)(in_RDX + (int)(in_stack_00000018 *
                              ((in_stack_00000010 + (uint)local_5e) * in_R8D + in_stack_00000008 +
                              (uint)local_5d))) = bVar1;
      if ((int)(uint)local_40[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3 + 1] < 0) {
        bVar1 = 0;
      }
      else if (local_40[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3 + 1] < 0x100) {
        bVar1 = local_40[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3 + 1];
      }
      else {
        bVar1 = 0xff;
      }
      *(byte *)(in_RDX + (int)(in_stack_00000018 *
                               ((in_stack_00000010 + (uint)local_5e) * in_R8D + in_stack_00000008 +
                               (uint)local_5d) + 1)) = bVar1;
      if ((int)(uint)local_40[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3 + 2] < 0) {
        bVar1 = 0;
      }
      else if (local_40[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3 + 2] < 0x100) {
        bVar1 = local_40[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3 + 2];
      }
      else {
        bVar1 = 0xff;
      }
      *(byte *)(in_RDX + (int)(in_stack_00000018 *
                               ((in_stack_00000010 + (uint)local_5e) * in_R8D + in_stack_00000008 +
                               (uint)local_5d) + 2)) = bVar1;
      if (local_58[(ulong)local_5e + (ulong)local_5d * 4] == 2) {
        (*in_RCX)[(int)(local_5c *
                       ((uint)local_5d + in_stack_00000008 +
                       ((uint)local_5e + in_stack_00000010) * in_R8D))] = '\0';
        *(undefined1 *)
         (in_RDX + (int)(in_stack_00000018 *
                        ((in_stack_00000010 + (uint)local_5e) * in_R8D + in_stack_00000008 +
                        (uint)local_5d))) = 0;
        *(undefined1 *)
         (in_RDX + (int)(in_stack_00000018 *
                         ((in_stack_00000010 + (uint)local_5e) * in_R8D + in_stack_00000008 +
                         (uint)local_5d) + 1)) = 0;
        *(undefined1 *)
         (in_RDX + (int)(in_stack_00000018 *
                         ((in_stack_00000010 + (uint)local_5e) * in_R8D + in_stack_00000008 +
                         (uint)local_5d) + 2)) = 0;
      }
      else {
        (*in_RCX)[(int)(local_5c *
                       ((uint)local_5d + in_stack_00000008 +
                       ((uint)local_5e + in_stack_00000010) * in_R8D))] = 0xff;
      }
    }
  }
  return;
}

Assistant:

void decompressBlockTHUMB58HAlphaC(unsigned int block_part1, unsigned int block_part2, uint8 *img, uint8* alpha, int width, int height, int startx, int starty, int channelsRGB)
{
	unsigned int col0, col1;
	uint8 colors[2][3];
	uint8 colorsRGB444[2][3];
	uint8 paint_colors[4][3];
	uint8 distance;
	uint8 block_mask[4][4];
  int channelsA;	

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alpha = &img[0+3];
  }

	// First decode left part of block.
	colorsRGB444[0][R]= GETBITSHIGH(block_part1, 4, 57);
	colorsRGB444[0][G]= GETBITSHIGH(block_part1, 4, 53);
	colorsRGB444[0][B]= GETBITSHIGH(block_part1, 4, 49);

	colorsRGB444[1][R]= GETBITSHIGH(block_part1, 4, 45);
	colorsRGB444[1][G]= GETBITSHIGH(block_part1, 4, 41);
	colorsRGB444[1][B]= GETBITSHIGH(block_part1, 4, 37);

  distance = 0;
	distance = (GETBITSHIGH(block_part1, 2, 33)) << 1;

	col0 = GETBITSHIGH(block_part1, 12, 57);
	col1 = GETBITSHIGH(block_part1, 12, 45);

	if(col0 >= col1)
	{
		distance |= 1;
	}

	// Extend the two colors to RGB888	
	decompressColor(R_BITS58H, G_BITS58H, B_BITS58H, colorsRGB444, colors);	
	
	calculatePaintColors58H(distance, PATTERN_H, colors, paint_colors);
	
	// Choose one of the four paint colors for each texel
	for (uint8 x = 0; x < BLOCKWIDTH; ++x) 
	{
		for (uint8 y = 0; y < BLOCKHEIGHT; ++y) 
		{
			//block_mask[x][y] = GETBITS(block_part2,2,31-(y*4+x)*2);
			block_mask[x][y] = GETBITS(block_part2,1,(y+x*4)+16)<<1;
			block_mask[x][y] |= GETBITS(block_part2,1,(y+x*4));
			img[channelsRGB*((starty+y)*width+startx+x)+R] =
				CLAMP(0,paint_colors[block_mask[x][y]][R],255); // RED
			img[channelsRGB*((starty+y)*width+startx+x)+G] =
				CLAMP(0,paint_colors[block_mask[x][y]][G],255); // GREEN
			img[channelsRGB*((starty+y)*width+startx+x)+B] =
				CLAMP(0,paint_colors[block_mask[x][y]][B],255); // BLUE
			
			if(block_mask[x][y]==2)  
			{
				alpha[channelsA*(x+startx+(y+starty)*width)]=0;
				img[channelsRGB*((starty+y)*width+startx+x)+R] =0;
				img[channelsRGB*((starty+y)*width+startx+x)+G] =0;
				img[channelsRGB*((starty+y)*width+startx+x)+B] =0;
			}
			else
				alpha[channelsA*(x+startx+(y+starty)*width)]=255;
		}
	}
}